

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              secp256k1_sha256 *s2c_sha,secp256k1_ecdsa_s2c_opening *s2c_opening,uchar *s2c_data32,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  ulong uVar1;
  long lVar2;
  uint *puVar3;
  secp256k1_ecdsa_s2c_opening *pubkey;
  int iVar4;
  uint uVar5;
  uint uVar6;
  code *pcVar7;
  void *data_size;
  uint uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uchar tweak [32];
  int overflow;
  secp256k1_ge nonce_p;
  int local_204;
  secp256k1_scalar *local_200;
  uint local_1f4;
  secp256k1_context *local_1f0;
  uint *local_1e8;
  secp256k1_sha256 *local_1e0;
  secp256k1_ecdsa_s2c_opening *local_1d8;
  secp256k1_nonce_function local_1d0;
  secp256k1_scalar local_1c8;
  uchar local_1a8 [32];
  uchar local_188 [32];
  secp256k1_scalar local_168;
  secp256k1_scalar local_148;
  secp256k1_gej local_128;
  secp256k1_ge local_a8;
  secp256k1_scalar local_50;
  
  r->d[2] = 0;
  r->d[3] = 0;
  r->d[0] = 0;
  r->d[1] = 0;
  s->d[2] = 0;
  s->d[3] = 0;
  s->d[0] = 0;
  s->d[1] = 0;
  if (recid != (int *)0x0) {
    *recid = 0;
  }
  pcVar7 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    pcVar7 = noncefp;
  }
  local_200 = r;
  local_1f0 = ctx;
  local_1e8 = (uint *)recid;
  local_1e0 = s2c_sha;
  local_1d8 = s2c_opening;
  secp256k1_scalar_set_b32(&local_148,seckey,(int *)&local_128);
  local_1f4 = (uint)(((local_148.d[2] != 0 || local_148.d[3] != 0) ||
                     (local_148.d[1] != 0 || local_148.d[0] != 0)) && (int)local_128.x.n[0] == 0);
  uVar1 = (ulong)(local_1f4 ^ 1) - 1;
  local_148.d[0] = local_148.d[0] & uVar1 | (ulong)(local_1f4 ^ 1);
  local_148.d[1] = local_148.d[1] & uVar1;
  local_148.d[2] = local_148.d[2] & uVar1;
  local_148.d[3] = uVar1 & local_148.d[3];
  uVar8 = 0;
  secp256k1_scalar_set_b32(&local_168,msg32,(int *)0x0);
  data_size = noncedata;
  local_1d0 = pcVar7;
  iVar4 = (*pcVar7)(local_1a8,msg32,seckey,(uchar *)0x0,noncedata,0);
  puVar3 = local_1e8;
  if (iVar4 != 0) {
    uVar9 = 1;
    do {
      secp256k1_scalar_set_b32(&local_1c8,local_1a8,(int *)&local_128);
      pubkey = local_1d8;
      if (((int)local_128.x.n[0] == 0) &&
         ((local_1c8.d[3] != 0 || local_1c8.d[1] != 0) ||
          (local_1c8.d[2] != 0 || local_1c8.d[0] != 0))) {
        if (s2c_data32 != (uchar *)0x0) {
          secp256k1_ecmult_gen(&local_1f0->ecmult_gen_ctx,&local_128,&local_1c8);
          secp256k1_ge_set_gej(&local_a8,&local_128);
          if (pubkey != (secp256k1_ecdsa_s2c_opening *)0x0) {
            secp256k1_pubkey_save((secp256k1_pubkey *)pubkey,&local_a8);
          }
          iVar4 = secp256k1_ec_commit_tweak
                            (local_188,&local_a8,local_1e0,s2c_data32,(size_t)data_size);
          if ((iVar4 == 0) ||
             (iVar4 = secp256k1_ec_seckey_tweak_add_helper(&local_1c8,local_188), iVar4 == 0)) {
            uVar8 = 0;
            break;
          }
        }
        local_204 = 0;
        secp256k1_ecmult_gen(&local_1f0->ecmult_gen_ctx,&local_128,&local_1c8);
        secp256k1_ge_set_gej(&local_a8,&local_128);
        secp256k1_fe_normalize(&local_a8.x);
        secp256k1_fe_normalize(&local_a8.y);
        secp256k1_fe_get_b32(local_188,&local_a8.x);
        secp256k1_scalar_set_b32(local_200,local_188,&local_204);
        if (puVar3 != (uint *)0x0) {
          *puVar3 = ((uint)local_a8.y.n[0] & 1) + local_204 * 2;
        }
        secp256k1_scalar_mul(&local_50,local_200,&local_148);
        secp256k1_scalar_add(&local_50,&local_50,&local_168);
        secp256k1_scalar_inverse(s,&local_1c8);
        secp256k1_scalar_mul(s,s,&local_50);
        uVar5 = (uint)(s->d[3] >> 0x3f);
        uVar6 = uVar5 ^ 1;
        uVar8 = uVar6;
        if (s->d[2] == 0xffffffffffffffff) {
          uVar8 = 0;
        }
        if (0x5d576e7357a4501c < s->d[1]) {
          uVar6 = 0;
        }
        uVar6 = (uVar6 | uVar8 | s->d[3] < 0x7fffffffffffffff) ^ 1;
        uVar8 = 0;
        if (0xdfe92f46681b20a0 < s->d[0]) {
          uVar8 = uVar6;
        }
        if (0x5d576e7357a4501d < s->d[1]) {
          uVar8 = uVar6;
        }
        uVar8 = uVar8 | uVar5;
        iVar4 = secp256k1_scalar_cond_negate(s,uVar8);
        if (puVar3 != (uint *)0x0) {
          *puVar3 = *puVar3 ^ uVar8;
        }
        auVar11._0_4_ = -(uint)((int)s->d[2] == 0 && (int)s->d[0] == 0);
        auVar11._4_4_ = -(uint)(*(int *)((long)s->d + 0x14) == 0 && *(int *)((long)s->d + 4) == 0);
        auVar11._8_4_ = -(uint)((int)s->d[3] == 0 && (int)s->d[1] == 0);
        auVar11._12_4_ =
             -(uint)(*(int *)((long)s->d + 0x1c) == 0 && *(int *)((long)s->d + 0xc) == 0);
        iVar4 = movmskps(iVar4,auVar11);
        if ((iVar4 != 0xf) &&
           ((local_200->d[3] != 0 || local_200->d[1] != 0) ||
            (local_200->d[2] != 0 || local_200->d[0] != 0))) {
          uVar8 = 1;
          break;
        }
      }
      uVar8 = 0;
      data_size = noncedata;
      iVar4 = (*local_1d0)(local_1a8,msg32,seckey,(uchar *)0x0,noncedata,uVar9);
      uVar9 = uVar9 + 1;
    } while (iVar4 != 0);
  }
  uVar9 = uVar8 & local_1f4 ^ 1;
  lVar2 = (ulong)uVar9 - 1;
  auVar10._8_4_ = (int)lVar2;
  auVar10._0_8_ = lVar2;
  auVar10._12_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar11 = *(undefined1 (*) [16])(local_200->d + 2);
  *(undefined1 (*) [16])local_200->d = *(undefined1 (*) [16])local_200->d & auVar10;
  *(undefined1 (*) [16])(local_200->d + 2) = auVar11 & auVar10;
  auVar11 = *(undefined1 (*) [16])(s->d + 2);
  *(undefined1 (*) [16])s->d = *(undefined1 (*) [16])s->d & auVar10;
  *(undefined1 (*) [16])(s->d + 2) = auVar11 & auVar10;
  if (puVar3 != (uint *)0x0) {
    *puVar3 = uVar9 - 1 & *puVar3;
  }
  return uVar8 & local_1f4;
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, secp256k1_sha256* s2c_sha, secp256k1_ecdsa_s2c_opening *s2c_opening, const unsigned char* s2c_data32, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }
    /* sign-to-contract commitments only work with the default nonce function,
     * because we need to ensure that s2c_data is actually hashed into the nonce and
     * not just ignored. Otherwise an attacker can exfiltrate the secret key by
     * signing the same message thrice with different commitments. */
    VERIFY_CHECK(s2c_data32 == NULL || noncefp == secp256k1_nonce_function_default);

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            if (s2c_data32 != NULL) {
                secp256k1_gej nonce_pj;
                secp256k1_ge nonce_p;

                /* Compute original nonce commitment/pubkey */
                secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &nonce_pj, &non);
                secp256k1_ge_set_gej(&nonce_p, &nonce_pj);
                if (s2c_opening != NULL) {
                    secp256k1_ecdsa_s2c_opening_save(s2c_opening, &nonce_p);
                }

                /* Because the nonce is valid, the nonce point isn't the point
                 * at infinity and we can declassify that information to be able to
                 * serialize the point. */
                secp256k1_declassify(ctx, &nonce_p.infinity, sizeof(nonce_p.infinity));

                /* Tweak nonce with s2c commitment. */
                ret = secp256k1_ec_commit_seckey(&non, &nonce_p, s2c_sha, s2c_data32, 32);
                secp256k1_declassify(ctx, &ret, sizeof(ret)); /* may be secret that the tweak falied, but happens with negligible probability */
                if (!ret) {
                    break;
                }
            }

            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    memset(nonce32, 0, 32);
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}